

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::DefaultsTest::testProgramPipelineParameter
          (DefaultsTest *this,GLenum pname,GLint expected_value)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLint value;
  int local_1ac;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1ac = -1;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x9a0))(this->m_program_pipeline_dsa,pname,&local_1ac)
  ;
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetProgramPipelineiv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                  ,0x126);
  if (local_1ac == -1) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glGetProgramPipelineiv with parameter ",0x26);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," has not returned anything and error has not been generated.",0x3c
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (local_1ac == expected_value) {
      return true;
    }
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"glGetProgramPipelineiv with parameter ",0x26);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," has returned ",0xe);
    std::ostream::operator<<(poVar1,local_1ac);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", however ",10);
    std::ostream::operator<<(poVar1,expected_value);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base(local_130);
  return false;
}

Assistant:

bool DefaultsTest::testProgramPipelineParameter(glw::GLenum pname, glw::GLint expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLint value = -1;

	gl.getProgramPipelineiv(m_program_pipeline_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv have failed");

	if (-1 == value)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetProgramPipelineiv with parameter "
											<< pname << " has not returned anything and error has not been generated."
											<< tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (expected_value != value)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetProgramPipelineiv with parameter "
												<< pname << " has returned " << value << ", however " << expected_value
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}